

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void * cf_lite_queue_pop_front(cf_lite_queue_t *self)

{
  void *data;
  cf_lite_queue_t *self_local;
  
  if (self->count == 0) {
    self_local = (cf_lite_queue_t *)0x0;
  }
  else {
    self_local = (cf_lite_queue_t *)cf_lite_queue_front(self);
    self->count = self->count - 1;
    if (self->count == 0) {
      self->head = 0;
      self->tail = 0;
    }
    else {
      self->head = (cf_uint_t)((ulong)(self->head + 1) % self->capacity);
    }
  }
  return self_local;
}

Assistant:

void* cf_lite_queue_pop_front(cf_lite_queue_t* self) {
    void* data = CF_NULL_PTR;
    if (cf_lite_queue_empty(self)) {
        return CF_NULL_PTR;
    }
    data = cf_lite_queue_front(self);
    self->count--;
    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->head = (self->head + 1) % self->capacity;
    }
    return data;
}